

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::relocate
          (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *this
          ,qsizetype offset,pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> **data)

{
  bool bVar1;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *res;
  
  first = (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)
          (*(long *)(in_RDI + 8) + in_RSI * 0x20);
  QtPrivate::
  q_relocate_overlap_n<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>,long_long>
            (first,in_RDI,(pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)0x8aa0a7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>>,std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>const*>
                        (data,(QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                               *)res), bVar1)) {
    *in_RDX = in_RSI * 0x20 + *in_RDX;
  }
  *(pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }